

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O1

double getAveLen(Mesh *mesh,VectorXd *x)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  long lVar7;
  int iVar8;
  double dVar9;
  undefined1 auVar10 [12];
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __begin1;
  undefined1 local_50 [16];
  double local_40;
  double local_38;
  
  local_50 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
  auVar10 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
  if (auVar10 == local_50._0_12_) {
    local_38 = NAN;
  }
  else {
    iVar8 = 0;
    local_38 = 0.0;
    auVar5 = local_50;
    do {
      lVar3 = *(long *)&(mesh->super_Mesh).
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                        .super_PolyConnectivity.field_0xe0;
      lVar7 = ((long)((ulong)(uint)local_50._8_4_ << 0x21) >> 0x21) * 0x20;
      iVar1 = *(int *)(lVar3 + 4 + lVar7);
      iVar2 = *(int *)(lVar3 + 0x14 + lVar7);
      pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      dVar9 = (pdVar4[iVar1 * 2 + 1] - pdVar4[iVar2 * 2 + 1]) *
              (pdVar4[iVar1 * 2 + 1] - pdVar4[iVar2 * 2 + 1]) +
              (pdVar4[(long)iVar1 * 2] - pdVar4[(long)iVar2 * 2]) *
              (pdVar4[(long)iVar1 * 2] - pdVar4[(long)iVar2 * 2]);
      local_50 = auVar5;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      local_50._8_4_ = local_50._8_4_ + 1;
      if (local_50._12_4_ != 0) {
        local_40 = dVar9;
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                    *)local_50);
        dVar9 = local_40;
      }
      auVar5._8_8_ = local_50._8_8_;
      auVar5._0_8_ = local_50._0_8_;
      local_38 = local_38 + dVar9;
      auVar6._8_4_ = local_50._8_4_;
      auVar6._0_8_ = local_50._0_8_;
      iVar8 = iVar8 + 1;
    } while (auVar10 != auVar6);
    local_38 = local_38 / (double)iVar8;
  }
  return local_38;
}

Assistant:

double getAveLen(const Mesh& mesh, const Eigen::VectorXd& x) {
    int count = 0;
    double len = 0.0;
    for (auto e: mesh.all_edges()) {
        ++count;
        int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
        int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
        OpenMesh::Vec2d ev(x[2 * st] - x[2 *end], x[2 * st + 1] - x[2 * end + 1]);
        len += ev.norm();
    }

    return len / count; 
}